

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O0

int __thiscall geemuboi::core::CPU::jp_nz_a16(CPU *this)

{
  ushort uVar1;
  int iVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  CPU *this_local;
  
  if ((this->regs->f & 0x80) == 0) {
    uVar1 = this->regs->pc;
    iVar2 = (*this->mmu->_vptr_IMmu[1])
                      (this->mmu,(ulong)uVar1,in_RDX,CONCAT62((int6)((ulong)in_RCX >> 0x10),uVar1));
    this->regs->pc = (uint16_t)iVar2;
    this_local._4_4_ = 4;
  }
  else {
    this->regs->pc = this->regs->pc + 2;
    this_local._4_4_ = 3;
  }
  return this_local._4_4_;
}

Assistant:

int CPU::jp_nz_a16() {
    if (!(regs.f & 0x80)) {
        regs.pc = mmu.read_word(regs.pc);
        return 4;
    } else {
        regs.pc += 2;
        return 3;
    }
}